

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O3

int opus_tags_parse_impl(OpusTags *_tags,uchar *_data,size_t _len)

{
  uint uVar1;
  char **ppcVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  ulong __n;
  ulong _ncomments;
  uchar *__src;
  uint *__src_00;
  ulong uVar6;
  ulong uVar7;
  
  if (_len < 8) {
    return -0x84;
  }
  if (*(long *)_data != 0x736761547375704f) {
    return -0x84;
  }
  if (_len < 0x10) {
    return -0x85;
  }
  uVar5 = (ulong)*(uint *)(_data + 8);
  uVar6 = (_len - 0xc) - uVar5;
  if (_len - 0xc < uVar5) {
    return -0x85;
  }
  __src = _data + 0xc;
  if (_tags != (OpusTags *)0x0) {
    pcVar4 = (char *)malloc(uVar5 + 1);
    if (pcVar4 == (char *)0x0) {
      _tags->vendor = (char *)0x0;
      return -0x81;
    }
    memcpy(pcVar4,__src,uVar5);
    pcVar4[uVar5] = '\0';
    _tags->vendor = pcVar4;
  }
  if (uVar6 < 4) {
    return -0x85;
  }
  _ncomments = (ulong)*(uint *)(__src + uVar5);
  uVar6 = uVar6 - 4;
  if (uVar6 >> 2 < _ncomments) {
    return -0x85;
  }
  if (*(uint *)(__src + uVar5) < 0x7fffffff) {
    if ((_tags != (OpusTags *)0x0) && (iVar3 = op_tags_ensure_capacity(_tags,_ncomments), iVar3 < 0)
       ) {
      return iVar3;
    }
    __src_00 = (uint *)(__src + uVar5 + 4);
    if (_ncomments != 0) {
      uVar5 = 0;
      do {
        if (uVar6 >> 2 < _ncomments - uVar5) {
          return -0x85;
        }
        uVar1 = *__src_00;
        __n = (ulong)uVar1;
        uVar7 = uVar6 - 4;
        uVar6 = uVar7 - __n;
        if (uVar7 < __n) {
          return -0x85;
        }
        if ((int)uVar1 < 0) {
          return -0x81;
        }
        if (_tags != (OpusTags *)0x0) {
          pcVar4 = (char *)malloc(__n + 1);
          if (pcVar4 != (char *)0x0) {
            memcpy(pcVar4,__src_00 + 1,__n);
            pcVar4[__n] = '\0';
          }
          _tags->user_comments[uVar5] = pcVar4;
          ppcVar2 = _tags->user_comments;
          if (ppcVar2[uVar5] == (char *)0x0) {
            return -0x81;
          }
          _tags->comment_lengths[uVar5] = uVar1;
          _tags->comments = (int)uVar5 + 1;
          ppcVar2[uVar5 + 1] = (char *)0x0;
        }
        uVar5 = uVar5 + 1;
        __src_00 = (uint *)((long)(__src_00 + 1) + __n);
      } while (uVar5 != _ncomments);
    }
    if (uVar6 == 0) {
      return 0;
    }
    if ((*__src_00 & 1) == 0) {
      return 0;
    }
    iVar3 = -0x81;
    if (uVar6 < 0x80000000) {
      iVar3 = 0;
    }
    if (_tags == (OpusTags *)0x0) {
      return iVar3;
    }
    if (0x7fffffff < uVar6) {
      return iVar3;
    }
    pcVar4 = (char *)malloc(uVar6);
    _tags->user_comments[_ncomments] = pcVar4;
    if (_tags->user_comments[_ncomments] != (char *)0x0) {
      memcpy(_tags->user_comments[_ncomments],__src_00,uVar6);
      _tags->comment_lengths[_ncomments] = (int)uVar6;
      return 0;
    }
  }
  return -0x81;
}

Assistant:

static int opus_tags_parse_impl(OpusTags *_tags,
 const unsigned char *_data,size_t _len){
  opus_uint32 count;
  size_t      len;
  int         ncomments;
  int         ci;
  len=_len;
  if(len<8)return OP_ENOTFORMAT;
  if(memcmp(_data,"OpusTags",8)!=0)return OP_ENOTFORMAT;
  if(len<16)return OP_EBADHEADER;
  _data+=8;
  len-=8;
  count=op_parse_uint32le(_data);
  _data+=4;
  len-=4;
  if(count>len)return OP_EBADHEADER;
  if(_tags!=NULL){
    _tags->vendor=op_strdup_with_len((char *)_data,count);
    if(_tags->vendor==NULL)return OP_EFAULT;
  }
  _data+=count;
  len-=count;
  if(len<4)return OP_EBADHEADER;
  count=op_parse_uint32le(_data);
  _data+=4;
  len-=4;
  /*Check to make sure there's minimally sufficient data left in the packet.*/
  if(count>len>>2)return OP_EBADHEADER;
  /*Check for overflow (the API limits this to an int).*/
  if(count>(opus_uint32)INT_MAX-1)return OP_EFAULT;
  if(_tags!=NULL){
    int ret;
    ret=op_tags_ensure_capacity(_tags,count);
    if(ret<0)return ret;
  }
  ncomments=(int)count;
  for(ci=0;ci<ncomments;ci++){
    /*Check to make sure there's minimally sufficient data left in the packet.*/
    if((size_t)(ncomments-ci)>len>>2)return OP_EBADHEADER;
    count=op_parse_uint32le(_data);
    _data+=4;
    len-=4;
    if(count>len)return OP_EBADHEADER;
    /*Check for overflow (the API limits this to an int).*/
    if(count>(opus_uint32)INT_MAX)return OP_EFAULT;
    if(_tags!=NULL){
      _tags->user_comments[ci]=op_strdup_with_len((char *)_data,count);
      if(_tags->user_comments[ci]==NULL)return OP_EFAULT;
      _tags->comment_lengths[ci]=(int)count;
      _tags->comments=ci+1;
      /*Needed by opus_tags_clear() if we fail before parsing the (optional)
         binary metadata.*/
      _tags->user_comments[ci+1]=NULL;
    }
    _data+=count;
    len-=count;
  }
  if(len>0&&(_data[0]&1)){
    if(len>(opus_uint32)INT_MAX)return OP_EFAULT;
    if(_tags!=NULL){
      _tags->user_comments[ncomments]=(char *)_ogg_malloc(len);
      if(OP_UNLIKELY(_tags->user_comments[ncomments]==NULL))return OP_EFAULT;
      memcpy(_tags->user_comments[ncomments],_data,len);
      _tags->comment_lengths[ncomments]=(int)len;
    }
  }
  return 0;
}